

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O2

void __thiscall
MIDIplay::noteUpdate
          (MIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  uint32_t *puVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  OPL3 *this_00;
  OplInstMeta *pOVar10;
  pointer pMVar11;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar12;
  NoteHook p_Var13;
  undefined8 uVar14;
  int iVar15;
  users_iterator uVar16;
  uint ccount;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  AdlChannel *this_01;
  ulong brightness;
  OplTimbre *instrument;
  uint16_t *ph;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Location my_loc;
  
  this_00 = (this->m_synth).m_p;
  iVar15 = (int)((i.cell_)->value).noteTone;
  dVar2 = ((i.cell_)->value).currentTone;
  bVar4 = ((i.cell_)->value).vol;
  iVar8 = (int)((i.cell_)->value).midiins;
  pOVar10 = ((i.cell_)->value).ains;
  my_loc.MidCh = (uint16_t)midCh;
  my_loc.note = ((i.cell_)->value).note;
  if (((i.cell_)->value).isBlank == true) {
    if ((props_mask & 0x20) != 0) {
      pl_list<MIDIplay::MIDIchannel::NoteInfo>::erase
                (&(this->m_midiChannels).
                  super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                  _M_impl.super__Vector_impl_data._M_start[midCh].activenotes,(iterator)i.cell_);
      return;
    }
  }
  else {
    uVar18 = (ulong)((i.cell_)->value).chip_channels_count;
    instrument = &((i.cell_)->value).chip_channels[0].op;
    while (bVar20 = uVar18 != 0, uVar18 = uVar18 - 1, bVar20) {
      uVar6._0_1_ = instrument[-1].feedconn;
      uVar6._1_1_ = instrument[-1].noteOffset;
      if (((props_mask & 1) != 0) && (select_adlchn < 0 || (uint)uVar6 == select_adlchn)) {
        ::OPL3::setPatch(this_00,(ulong)uVar6,instrument);
        uVar16 = AdlChannel::find_or_create_user
                           ((this->m_chipChannels).
                            super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar6,&my_loc);
        if (((uVar16.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next !=
            (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) {
          ((uVar16.cell_)->value).sustained = 0;
          ((uVar16.cell_)->value).vibdelay_us = 0;
          uVar6 = pOVar10->soundKeyOnMs;
          ((uVar16.cell_)->value).fixed_sustain = (ulong)uVar6 == 40000;
          ((uVar16.cell_)->value).kon_time_until_neglible_us = (ulong)uVar6 * 1000;
          uVar14 = *(undefined8 *)((long)&instrument->carrier_E862 + 2);
          *(undefined8 *)&((uVar16.cell_)->value).ins = *(undefined8 *)&instrument[-1].feedconn;
          *(undefined8 *)((long)&((uVar16.cell_)->value).ins.op.carrier_E862 + 2) = uVar14;
        }
      }
      instrument = (OplTimbre *)&instrument[1].carrier_E862;
    }
    for (uVar17 = 0; uVar9 = ((i.cell_)->value).chip_channels_count, uVar17 < uVar9;
        uVar17 = uVar17 + 1) {
      uVar6 = ((i.cell_)->value).chip_channels[uVar17].chip_chan;
      uVar18 = (ulong)uVar6;
      uVar7 = ((i.cell_)->value).chip_channels[1].chip_chan;
      if ((select_adlchn < 0) || ((uint)uVar6 == select_adlchn)) {
        ph = &((i.cell_)->value).chip_channels[uVar17].chip_chan;
        if ((props_mask & 0x20) == 0) {
          if ((props_mask & 2) != 0) {
            ::OPL3::setPan(this_00,uVar18,
                           (this->m_midiChannels).
                           super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                           ._M_impl.super__Vector_impl_data._M_start[midCh].panning);
          }
          if ((props_mask & 4) != 0) {
            pMVar11 = (this->m_midiChannels).
                      super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar19 = pMVar11[midCh].brightness;
            brightness = (ulong)((uint)bVar19 + (uint)bVar19);
            if (0x3f < bVar19) {
              brightness = 0x7f;
            }
            if ((this->m_setup).fullRangeBrightnessCC74 != false) {
              brightness = (ulong)bVar19;
            }
            ::OPL3::touchNote(this_00,uVar18,(ulong)bVar4,(ulong)pMVar11[midCh].volume,
                              (ulong)pMVar11[midCh].expression,brightness,
                              (bool)(midCh == 9 | pMVar11[midCh].is_xg_percussion & 1U));
          }
          if ((props_mask & 8) != 0) {
            uVar16 = AdlChannel::find_user
                               ((this->m_chipChannels).
                                super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar18,&my_loc);
            ppVar12 = ((uVar16.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next
            ;
            if ((ppVar12 == (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) ||
               (((uVar16.cell_)->value).sustained == 0)) {
              pMVar11 = (this->m_midiChannels).
                        super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar19 = pMVar11[midCh].aftertouch;
              if (pMVar11[midCh].aftertouch < pMVar11[midCh].vibrato) {
                bVar19 = pMVar11[midCh].vibrato;
              }
              bVar5 = ((i.cell_)->value).vibrato;
              if (bVar19 <= bVar5) {
                bVar19 = bVar5;
              }
              dVar21 = 0.0;
              if (((pOVar10->flags & 1) != 0) && (*(bool *)(ph + 7) == true)) {
                dVar21 = pOVar10->voice2_fine_tune;
              }
              dVar23 = (double)pMVar11[midCh].bend * pMVar11[midCh].bendsense;
              dVar24 = (double)(int)*(int8_t *)((long)ph + 0xd) + dVar23;
              if ((bVar19 != 0) &&
                 ((ppVar12 == (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0 ||
                  (pMVar11[midCh].vibdelay_us <= ((uVar16.cell_)->value).vibdelay_us)))) {
                dVar3 = pMVar11[midCh].vibdepth;
                dVar22 = sin(pMVar11[midCh].vibpos);
                dVar24 = dVar24 + dVar22 * (double)bVar19 * dVar3;
              }
              ::OPL3::noteOn(this_00,uVar18,(ulong)uVar7,dVar21 + dVar24 + dVar2);
              p_Var13 = (this->hooks).onNote;
              if (p_Var13 != (NoteHook)0x0) {
                (*p_Var13)((this->hooks).onNote_userData,(uint)uVar6,iVar15,iVar8,(uint)bVar4,dVar23
                          );
              }
            }
          }
        }
        else {
          this_01 = (this->m_chipChannels).
                    super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar18;
          if ((this->m_midiChannels).
              super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
              _M_impl.super__Vector_impl_data._M_start[midCh].sustain == false) {
            uVar16 = AdlChannel::find_user(this_01,&my_loc);
            if ((((uVar16.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next ==
                 (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) ||
               ((((uVar16.cell_)->value).sustained & 2) != 0)) {
              bVar20 = false;
            }
            else {
              pl_list<MIDIplay::AdlChannel::LocationData>::erase
                        (&(this->m_chipChannels).
                          super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar18].users,
                         (iterator)uVar16.cell_);
              bVar20 = true;
            }
            p_Var13 = (this->hooks).onNote;
            if (p_Var13 != (NoteHook)0x0) {
              (*p_Var13)((this->hooks).onNote_userData,(uint)uVar6,iVar15,iVar8,0,0.0);
            }
            if ((bVar20) &&
               ((this->m_chipChannels).
                super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar18].users.size_ == 0)) {
              ::OPL3::noteOff(this_00,uVar18);
              if ((props_mask & 0x40) == 0) {
                (this->m_chipChannels).
                super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar18].koff_time_until_neglible_us =
                     (ulong)pOVar10->soundKeyOffMs * 1000;
              }
              else {
                ::OPL3::touchNote(this_00,uVar18,0,0,0,0x7f,false);
                (this->m_chipChannels).
                super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar18].koff_time_until_neglible_us = 0;
              }
            }
          }
          else {
            uVar16 = AdlChannel::find_or_create_user(this_01,&my_loc);
            if (((uVar16.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next !=
                (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) {
              puVar1 = &((uVar16.cell_)->value).sustained;
              *(byte *)puVar1 = (byte)*puVar1 | 1;
            }
            p_Var13 = (this->hooks).onNote;
            if (p_Var13 != (NoteHook)0x0) {
              (*p_Var13)((this->hooks).onNote_userData,(uint)uVar6,iVar15,iVar8,-1,0.0);
            }
          }
          MIDIchannel::NoteInfo::phys_erase_at(&(i.cell_)->value,(Phys *)ph);
          uVar17 = uVar17 - 1;
        }
      }
    }
    if (uVar9 == 0) {
      MIDIchannel::cleanupNote
                ((this->m_midiChannels).
                 super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                 _M_impl.super__Vector_impl_data._M_start + midCh,i);
      pl_list<MIDIplay::MIDIchannel::NoteInfo>::erase
                (&(this->m_midiChannels).
                  super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                  _M_impl.super__Vector_impl_data._M_start[midCh].activenotes,(iterator)i.cell_);
    }
  }
  return;
}

Assistant:

void MIDIplay::noteUpdate(size_t midCh,
                          MIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const int midiins     = static_cast<int>(info.midiins);
    const OplInstMeta &ains = *info.ains;
    AdlChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.op);
            AdlChannel::users_iterator i = m_chipChannels[c].find_or_create_user(my_loc);
            if(!i.is_end())    // inserts if necessary
            {
                AdlChannel::LocationData &d = i->value;
                d.sustained = AdlChannel::LocationData::Sustain_None;
                d.vibdelay_us = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(OPLNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c          = ins.chip_chan;
        uint16_t c_secondary    = info.chip_channels[1].chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(!m_midiChannels[midCh].sustain)
            {
                AdlChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & AdlChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0, 0, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                AdlChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= AdlChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            brightness,
                            is_percussion);

            /* DEBUG ONLY!!!
            static uint32_t max = 0;

            if(volume == 0)
                max = 0;

            if(volume > max)
                max = volume;

            printf("%d\n", max);
            fflush(stdout);
            */
        }

        if(props_mask & Upd_Pitch)
        {
            AdlChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == AdlChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.op.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OplInstMeta::Flag_Pseudo4op) && ins.pseudo4op)
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, c_secondary, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}